

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3auxColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  Mem *pMem;
  sqlite3_module *val;
  int n;
  sqlite3_vtab *z;
  _func_void_void_ptr *xDel;
  
  switch(iCol) {
  case 0:
    z = pCursor[8].pVtab;
    n = *(int *)&pCursor[9].pVtab;
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    goto LAB_001c2a2c;
  case 1:
    if ((long)*(int *)&pCursor[0x13].pVtab != 0) {
      val = (sqlite3_module *)((long)*(int *)&pCursor[0x13].pVtab + -1);
      break;
    }
    z = (sqlite3_vtab *)0x2016b8;
    n = -1;
    xDel = (_func_void_void_ptr *)0x0;
LAB_001c2a2c:
    setResultStrOrError(pCtx,(char *)z,n,'\x01',xDel);
    return 0;
  case 2:
    val = (&(pCursor[0x14].pVtab)->pModule)[(long)*(int *)&pCursor[0x13].pVtab * 2];
    break;
  case 3:
    val = *(sqlite3_module **)
           (&(pCursor[0x14].pVtab)->nRef + (long)*(int *)&pCursor[0x13].pVtab * 4);
    break;
  default:
    val = (sqlite3_module *)(long)*(int *)((long)&pCursor[0x10].pVtab + 4);
  }
  pMem = pCtx->pOut;
  if ((pMem->flags & 0x9000) == 0) {
    (pMem->u).i = (i64)val;
    pMem->flags = 4;
  }
  else {
    vdbeReleaseAndSetInt64(pMem,(i64)val);
  }
  return 0;
}

Assistant:

static int fts3auxColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts3auxCursor *p = (Fts3auxCursor *)pCursor;

  assert( p->isEof==0 );
  switch( iCol ){
    case 0: /* term */
      sqlite3_result_text(pCtx, p->csr.zTerm, p->csr.nTerm, SQLITE_TRANSIENT);
      break;

    case 1: /* col */
      if( p->iCol ){
        sqlite3_result_int(pCtx, p->iCol-1);
      }else{
        sqlite3_result_text(pCtx, "*", -1, SQLITE_STATIC);
      }
      break;

    case 2: /* documents */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nDoc);
      break;

    case 3: /* occurrences */
      sqlite3_result_int64(pCtx, p->aStat[p->iCol].nOcc);
      break;

    default: /* languageid */
      assert( iCol==4 );
      sqlite3_result_int(pCtx, p->iLangid);
      break;
  }

  return SQLITE_OK;
}